

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
ocl::getProgramBinaries
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          cl_program program)

{
  cl_int cVar1;
  uchar *data;
  size_t binaries_size;
  pointer local_78;
  size_type local_70;
  string local_68;
  string local_48;
  
  cVar1 = clGetProgramInfo(program,0x1165,8,&local_70,(size_t *)0x0);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  reportError(cVar1,0x1e6,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,local_70,(allocator_type *)&local_78);
  local_78 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
  cVar1 = clGetProgramInfo(program,0x1166,8,&local_78,(size_t *)0x0);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  reportError(cVar1,0x1eb,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> getProgramBinaries(cl_program program)
	{
		size_t binaries_size;
		OCL_SAFE_CALL(clGetProgramInfo(program, CL_PROGRAM_BINARY_SIZES,
									   sizeof(size_t), &binaries_size, NULL));

		std::vector<unsigned char> binaries(binaries_size);
		unsigned char *data = binaries.data();
		OCL_SAFE_CALL(clGetProgramInfo(program, CL_PROGRAM_BINARIES,
									   sizeof(unsigned char *), &data, NULL));

		return binaries;
	}